

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sunstepper.c
# Opt level: O0

int ARKodeCreateSUNStepper(void *arkode_mem,SUNStepper *stepper)

{
  int iVar1;
  undefined8 *in_RSI;
  ARKodeMem in_RDI;
  SUNErrCode err;
  ARKodeMem ark_mem;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,200,"ARKodeCreateSUNStepper",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sunstepper.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    iVar1 = SUNStepper_Create(in_RDI->sunctx,in_RSI);
    if (iVar1 == 0) {
      iVar1 = SUNStepper_SetContent(*in_RSI,in_RDI);
      if (iVar1 == 0) {
        iVar1 = SUNStepper_SetEvolveFn(*in_RSI,arkSUNStepperEvolve);
        if (iVar1 == 0) {
          iVar1 = SUNStepper_SetOneStepFn(*in_RSI,arkSUNStepperOneStep);
          if (iVar1 == 0) {
            iVar1 = SUNStepper_SetFullRhsFn(*in_RSI,arkSUNStepperFullRhs);
            if (iVar1 == 0) {
              iVar1 = SUNStepper_SetResetFn(*in_RSI,arkSUNStepperReset);
              if (iVar1 == 0) {
                iVar1 = SUNStepper_SetResetCheckpointIndexFn
                                  (*in_RSI,arkSUNStepperResetCheckpointIndex);
                if (iVar1 == 0) {
                  iVar1 = SUNStepper_SetStopTimeFn(*in_RSI,arkSUNStepperSetStopTime);
                  if (iVar1 == 0) {
                    iVar1 = SUNStepper_SetStepDirectionFn(*in_RSI,arkSUNStepperSetStepDirection);
                    if (iVar1 == 0) {
                      if ((in_RDI->step_setforcing == (ARKTimestepSetForcingFn)0x0) ||
                         (iVar1 = SUNStepper_SetForcingFn(*in_RSI,arkSUNStepperSetForcing),
                         iVar1 == 0)) {
                        iVar1 = SUNStepper_SetGetNumStepsFn(*in_RSI,arkSUNStepperGetNumSteps);
                        if (iVar1 == 0) {
                          local_4 = 0;
                        }
                        else {
                          arkProcessError(in_RDI,-0x33,0x120,"ARKodeCreateSUNStepper",
                                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sunstepper.c"
                                          ,"Failed to set SUNStepper get number of steps function");
                          local_4 = -0x33;
                        }
                      }
                      else {
                        arkProcessError(in_RDI,-0x33,0x117,"ARKodeCreateSUNStepper",
                                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sunstepper.c"
                                        ,"Failed to set SUNStepper forcing function");
                        local_4 = -0x33;
                      }
                    }
                    else {
                      local_4 = -0x33;
                    }
                  }
                  else {
                    arkProcessError(in_RDI,-0x33,0x10a,"ARKodeCreateSUNStepper",
                                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sunstepper.c"
                                    ,"Failed to set SUNStepper stop time function");
                    local_4 = -0x33;
                  }
                }
                else {
                  arkProcessError(in_RDI,-0x33,0x102,"ARKodeCreateSUNStepper",
                                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sunstepper.c"
                                  ,"Failed to set SUNStepper reset function");
                  local_4 = -0x33;
                }
              }
              else {
                arkProcessError(in_RDI,-0x33,0xf9,"ARKodeCreateSUNStepper",
                                "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sunstepper.c"
                                ,"Failed to set SUNStepper reset function");
                local_4 = -0x33;
              }
            }
            else {
              arkProcessError(in_RDI,-0x33,0xf1,"ARKodeCreateSUNStepper",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sunstepper.c"
                              ,"Failed to set SUNStepper full RHS function");
              local_4 = -0x33;
            }
          }
          else {
            arkProcessError(in_RDI,-0x33,0xe9,"ARKodeCreateSUNStepper",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sunstepper.c"
                            ,"Failed to set SUNStepper one step function");
            local_4 = -0x33;
          }
        }
        else {
          arkProcessError(in_RDI,-0x33,0xe1,"ARKodeCreateSUNStepper",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sunstepper.c"
                          ,"Failed to set SUNStepper evolve function");
          local_4 = -0x33;
        }
      }
      else {
        arkProcessError(in_RDI,-0x33,0xd9,"ARKodeCreateSUNStepper",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sunstepper.c"
                        ,"Failed to set SUNStepper content");
        local_4 = -0x33;
      }
    }
    else {
      arkProcessError(in_RDI,-0x33,0xd1,"ARKodeCreateSUNStepper",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sunstepper.c"
                      ,"Failed to create SUNStepper");
      local_4 = -0x33;
    }
  }
  return local_4;
}

Assistant:

int ARKodeCreateSUNStepper(void* arkode_mem, SUNStepper* stepper)
{
  /* unpack ark_mem */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return ARK_MEM_NULL;
  }
  ARKodeMem ark_mem = (ARKodeMem)arkode_mem;

  SUNErrCode err = SUNStepper_Create(ark_mem->sunctx, stepper);
  if (err != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_SUNSTEPPER_ERR, __LINE__, __func__, __FILE__,
                    "Failed to create SUNStepper");
    return ARK_SUNSTEPPER_ERR;
  }

  err = SUNStepper_SetContent(*stepper, arkode_mem);
  if (err != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_SUNSTEPPER_ERR, __LINE__, __func__, __FILE__,
                    "Failed to set SUNStepper content");
    return ARK_SUNSTEPPER_ERR;
  }

  err = SUNStepper_SetEvolveFn(*stepper, arkSUNStepperEvolve);
  if (err != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_SUNSTEPPER_ERR, __LINE__, __func__, __FILE__,
                    "Failed to set SUNStepper evolve function");
    return ARK_SUNSTEPPER_ERR;
  }

  err = SUNStepper_SetOneStepFn(*stepper, arkSUNStepperOneStep);
  if (err != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_SUNSTEPPER_ERR, __LINE__, __func__, __FILE__,
                    "Failed to set SUNStepper one step function");
    return ARK_SUNSTEPPER_ERR;
  }

  err = SUNStepper_SetFullRhsFn(*stepper, arkSUNStepperFullRhs);
  if (err != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_SUNSTEPPER_ERR, __LINE__, __func__, __FILE__,
                    "Failed to set SUNStepper full RHS function");
    return ARK_SUNSTEPPER_ERR;
  }

  err = SUNStepper_SetResetFn(*stepper, arkSUNStepperReset);
  if (err != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_SUNSTEPPER_ERR, __LINE__, __func__, __FILE__,
                    "Failed to set SUNStepper reset function");
    return ARK_SUNSTEPPER_ERR;
  }

  err = SUNStepper_SetResetCheckpointIndexFn(*stepper,
                                             arkSUNStepperResetCheckpointIndex);
  if (err != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_SUNSTEPPER_ERR, __LINE__, __func__, __FILE__,
                    "Failed to set SUNStepper reset function");
    return ARK_SUNSTEPPER_ERR;
  }

  err = SUNStepper_SetStopTimeFn(*stepper, arkSUNStepperSetStopTime);
  if (err != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_SUNSTEPPER_ERR, __LINE__, __func__, __FILE__,
                    "Failed to set SUNStepper stop time function");
    return ARK_SUNSTEPPER_ERR;
  }

  err = SUNStepper_SetStepDirectionFn(*stepper, arkSUNStepperSetStepDirection);
  if (err != SUN_SUCCESS) { return ARK_SUNSTEPPER_ERR; }

  if (ark_mem->step_setforcing != NULL)
  {
    err = SUNStepper_SetForcingFn(*stepper, arkSUNStepperSetForcing);
    if (err != SUN_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_SUNSTEPPER_ERR, __LINE__, __func__, __FILE__,
                      "Failed to set SUNStepper forcing function");
      return ARK_SUNSTEPPER_ERR;
    }
  }

  err = SUNStepper_SetGetNumStepsFn(*stepper, arkSUNStepperGetNumSteps);
  if (err != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_SUNSTEPPER_ERR, __LINE__, __func__, __FILE__,
                    "Failed to set SUNStepper get number of steps function");
    return ARK_SUNSTEPPER_ERR;
  }

  return ARK_SUCCESS;
}